

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

bool __thiscall
google::protobuf::io::CodedInputStream::GetDirectBufferPointer
          (CodedInputStream *this,void **data,int *size)

{
  bool bVar1;
  int iVar2;
  int *in_RDX;
  undefined8 *in_RSI;
  CodedInputStream *in_RDI;
  CodedInputStream *in_stack_000000a8;
  
  iVar2 = BufferSize(in_RDI);
  if ((iVar2 == 0) && (bVar1 = Refresh(in_stack_000000a8), !bVar1)) {
    return false;
  }
  *in_RSI = in_RDI->buffer_;
  iVar2 = BufferSize(in_RDI);
  *in_RDX = iVar2;
  return true;
}

Assistant:

bool CodedInputStream::GetDirectBufferPointer(const void** data, int* size) {
  if (BufferSize() == 0 && !Refresh()) return false;

  *data = buffer_;
  *size = BufferSize();
  return true;
}